

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uvector.cpp
# Opt level: O1

void __thiscall icu_63::UVector::setElementAt(UVector *this,void *obj,int32_t index)

{
  if ((-1 < index) && (index < this->count)) {
    if ((this->elements[(uint)index].pointer != (void *)0x0) &&
       (this->deleter != (UObjectDeleter *)0x0)) {
      (*this->deleter)(this->elements[(uint)index].pointer);
    }
    this->elements[(uint)index].pointer = obj;
  }
  return;
}

Assistant:

void UVector::setElementAt(void* obj, int32_t index) {
    if (0 <= index && index < count) {
        if (elements[index].pointer != 0 && deleter != 0) {
            (*deleter)(elements[index].pointer);
        }
        elements[index].pointer = obj;
    }
    /* else index out of range */
}